

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall
soul::StructuralParser::parseDotOperator(StructuralParser *this,Expression *expression)

{
  TypeMetaFunction *elementType;
  DotOperator *expression_00;
  Op local_5c;
  UnqualifiedName *pUStack_58;
  Op metaTypeOp;
  UnqualifiedName *propertyOrMethodName;
  char *local_40;
  undefined1 local_38 [8];
  Context context;
  Expression *expression_local;
  StructuralParser *this_local;
  
  context.parentScope = (Scope *)expression;
  getContext((Context *)local_38,this);
  local_40 = ".";
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x548358);
  pUStack_58 = parseUnqualifiedName(this);
  local_5c = getOpForTypeMetaFunctionName(pUStack_58);
  if (local_5c == none) {
    expression_00 =
         allocate<soul::AST::DotOperator,soul::AST::Context&,soul::AST::Expression&,soul::AST::UnqualifiedName&>
                   (this,(Context *)local_38,(Expression *)context.parentScope,pUStack_58);
    this_local = (StructuralParser *)parseSuffixes(this,&expression_00->super_Expression);
  }
  else {
    elementType = allocate<soul::AST::TypeMetaFunction,soul::AST::Context&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op&>
                            (this,&(pUStack_58->super_Expression).super_Statement.super_ASTObject.
                                   context,(Expression *)context.parentScope,&local_5c);
    this_local = (StructuralParser *)
                 parseVectorOrArrayTypeSuffixes
                           (this,&elementType->super_Expression,metaFunctionArgument);
  }
  AST::Context::~Context((Context *)local_38);
  return (Expression *)this_local;
}

Assistant:

AST::Expression& parseDotOperator (AST::Expression& expression)
    {
        auto context = getContext();
        expect (Operator::dot);
        auto& propertyOrMethodName = parseUnqualifiedName();

        auto metaTypeOp = getOpForTypeMetaFunctionName (propertyOrMethodName);

        if (metaTypeOp != AST::TypeMetaFunction::Op::none)
            return parseVectorOrArrayTypeSuffixes (allocate<AST::TypeMetaFunction> (propertyOrMethodName.context, expression, metaTypeOp),
                                                   ParseTypeContext::metaFunctionArgument);

        return parseSuffixes (allocate<AST::DotOperator> (context, expression, propertyOrMethodName));
    }